

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::flushRawStack(SimpleLoggerMgr *this,RawStackInfo *stack_info)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  ostream *poVar4;
  void *pvVar5;
  reference ppvVar6;
  void *this_00;
  uint *in_RSI;
  long in_RDI;
  void *stack_ptr;
  iterator __end1;
  iterator __begin1;
  vector<void_*,_std::allocator<void_*>_> *__range1;
  vector<void_*,_std::allocator<void_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  uint *local_20;
  char local_15;
  int local_14;
  uint *local_10;
  
  local_10 = in_RSI;
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x228),"Thread ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    local_14 = (int)std::setw(4);
    poVar4 = std::operator<<(poVar3,(_Setw)local_14);
    local_15 = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_15);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*local_10);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
    poVar4 = std::operator<<(poVar4," ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*(ulong *)(local_10 + 2));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    if ((local_10[10] & 1) != 0) {
      poVar4 = std::operator<<((ostream *)(in_RDI + 0x228),"(crashed here)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_20 = local_10 + 4;
    local_28._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(in_stack_ffffffffffffffa8);
    std::vector<void_*,_std::allocator<void_*>_>::end(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                               *)poVar3,
                              (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      ppvVar6 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&local_28);
      pvVar5 = *ppvVar6;
      this_00 = (void *)std::ostream::operator<<((void *)(in_RDI + 0x228),std::hex);
      pvVar5 = (void *)std::ostream::operator<<(this_00,pvVar5);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::dec);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&local_28);
    }
    std::ostream::operator<<((void *)(in_RDI + 0x228),std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushRawStack(RawStackInfo& stack_info) {
    if (!crashDumpFile.is_open()) return;

    crashDumpFile << "Thread " << std::hex << std::setw(4) << std::setfill('0')
                  << stack_info.tidHash << std::dec
                  << " " << stack_info.kernelTid << std::endl;
    if (stack_info.crashOrigin) {
        crashDumpFile << "(crashed here)" << std::endl;
    }
    for (void* stack_ptr: stack_info.stackPtrs) {
        crashDumpFile << std::hex << stack_ptr << std::dec << std::endl;
    }
    crashDumpFile << std::endl;
}